

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ShapeFunctionsDerivativeX
          (ChElementShellANCF_3423 *this,ShapeVector *Nx,double x,double y,double z)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  
  auVar4 = vpermi2pd_avx512f(_DAT_009aaec0,ZEXT864((ulong)(1.0 - y)),
                             ZEXT1664(CONCAT88(y + 1.0,y + 1.0)));
  auVar7._8_8_ = 0x3fd0000000000000;
  auVar7._0_8_ = 0x3fd0000000000000;
  auVar8._16_8_ = 0x3fd0000000000000;
  auVar8._0_16_ = auVar7;
  auVar8._24_8_ = 0x3fd0000000000000;
  auVar1._8_8_ = this->m_lenX;
  auVar1._0_8_ = this->m_lenX;
  auVar3 = vdivpd_avx512vl(_DAT_009aa830,auVar1);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = z * this->m_thickness * 0.5 * 0.25;
  auVar1 = vunpcklpd_avx(auVar7,auVar5);
  auVar8 = vblendpd_avx(auVar8,ZEXT1632(auVar1),3);
  auVar8 = vpermpd_avx2(auVar8,100);
  auVar2 = vpermpd_avx2(ZEXT1632(auVar3),0x50);
  auVar6 = ZEXT3264(CONCAT824(auVar2._24_8_ * auVar8._24_8_,
                              CONCAT816(auVar2._16_8_ * auVar8._16_8_,
                                        CONCAT88(auVar2._8_8_ * auVar8._8_8_,
                                                 auVar2._0_8_ * auVar8._0_8_))));
  auVar6 = vshuff64x2_avx512f(auVar6,auVar6,0x14);
  auVar4 = vmulpd_avx512f(auVar4,auVar6);
  *(undefined1 (*) [64])
   (Nx->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar4;
  return;
}

Assistant:

void ChElementShellANCF_3423::ShapeFunctionsDerivativeX(ShapeVector& Nx, double x, double y, double z) {
    double a = GetLengthX();
    double c = m_thickness;

    Nx(0) = 0.25 * (-2.0 / a) * (1.0 - y);
    Nx(1) = z * c / 2.0 * 0.25 * (-2.0 / a) * (1.0 - y);
    Nx(2) = 0.25 * (2.0 / a) * (1.0 - y);
    Nx(3) = z * c / 2.0 * 0.25 * (2.0 / a) * (1.0 - y);
    Nx(4) = 0.25 * (2.0 / a) * (1.0 + y);
    Nx(5) = z * c / 2.0 * 0.25 * (2.0 / a) * (1.0 + y);
    Nx(6) = 0.25 * (-2.0 / a) * (1.0 + y);
    Nx(7) = z * c / 2.0 * 0.25 * (-2.0 / a) * (1.0 + y);
}